

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Hashing::compute_hash_render_pass
               (VkRenderPassCreateInfo *create_info,Hash *out_hash)

{
  bool bVar1;
  Hash HVar2;
  VkSubpassDescription *subpass;
  uint32_t i_2;
  VkSubpassDependency *dep;
  uint32_t i_1;
  VkAttachmentDescription *att;
  uint32_t i;
  Hasher h;
  Hash *out_hash_local;
  VkRenderPassCreateInfo *create_info_local;
  
  h.h = (Hash)out_hash;
  Hasher::Hasher((Hasher *)&stack0xffffffffffffffd8);
  if (create_info->flags != 0) {
    Hasher::u32((Hasher *)&stack0xffffffffffffffd8,create_info->flags);
  }
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,create_info->attachmentCount);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,create_info->dependencyCount);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,create_info->subpassCount);
  for (att._4_4_ = 0; att._4_4_ < create_info->attachmentCount; att._4_4_ = att._4_4_ + 1) {
    hash_attachment((Hasher *)&stack0xffffffffffffffd8,create_info->pAttachments + att._4_4_);
  }
  for (dep._4_4_ = 0; dep._4_4_ < create_info->dependencyCount; dep._4_4_ = dep._4_4_ + 1) {
    hash_dependency((Hasher *)&stack0xffffffffffffffd8,create_info->pDependencies + dep._4_4_);
  }
  for (subpass._4_4_ = 0; subpass._4_4_ < create_info->subpassCount;
      subpass._4_4_ = subpass._4_4_ + 1) {
    hash_subpass((Hasher *)&stack0xffffffffffffffd8,create_info->pSubpasses + subpass._4_4_);
  }
  bVar1 = hash_pnext_chain((StateRecorder *)0x0,(Hasher *)&stack0xffffffffffffffd8,
                           create_info->pNext,(DynamicStateInfo *)0x0,0);
  if (bVar1) {
    HVar2 = Hasher::get((Hasher *)&stack0xffffffffffffffd8);
    *(Hash *)h.h = HVar2;
  }
  return bVar1;
}

Assistant:

bool compute_hash_render_pass(const VkRenderPassCreateInfo &create_info, Hash *out_hash)
{
	Hasher h;

	// Conditionally branch to remain hash compatible.
	if (create_info.flags != 0)
		h.u32(create_info.flags);

	h.u32(create_info.attachmentCount);
	h.u32(create_info.dependencyCount);
	h.u32(create_info.subpassCount);

	for (uint32_t i = 0; i < create_info.attachmentCount; i++)
	{
		auto &att = create_info.pAttachments[i];
		hash_attachment(h, att);
	}

	for (uint32_t i = 0; i < create_info.dependencyCount; i++)
	{
		auto &dep = create_info.pDependencies[i];
		hash_dependency(h, dep);
	}

	for (uint32_t i = 0; i < create_info.subpassCount; i++)
	{
		auto &subpass = create_info.pSubpasses[i];
		hash_subpass(h, subpass);
	}

	if (!hash_pnext_chain(nullptr, h, create_info.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}